

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O0

int arg_analyze(int argc,char **argv)

{
  int iVar1;
  char *local_28;
  char *pos;
  int i;
  char **argv_local;
  int argc_local;
  
  g_param.option = OPTION_HIGH_PREC;
  g_param.msq_key = 0x7045;
  g_param.output_lv = OUTPUT_LV_INFO;
  g_param.speed = 0;
  g_param.ssm_id = 0;
  strcpy(g_param.parameter_filename,"./robot.param");
  strcpy(g_param.device_name,"/dev/ttyUSB0");
  for (pos._4_4_ = 1; pos._4_4_ < argc; pos._4_4_ = pos._4_4_ + 1) {
    iVar1 = strcmp(argv[pos._4_4_],"--help");
    if ((iVar1 == 0) || (iVar1 = strcmp(argv[pos._4_4_],"-h"), iVar1 == 0)) {
      g_param.option = g_param.option | OPTION_SHOW_HELP;
    }
    else {
      iVar1 = strcmp(argv[pos._4_4_],"--long-help");
      if (iVar1 == 0) {
        g_param.option = g_param.option | OPTION_SHOW_LONGHELP;
      }
      else {
        iVar1 = strcmp(argv[pos._4_4_],"--daemon");
        if (iVar1 == 0) {
          g_param.option = g_param.option | OPTION_DAEMON;
        }
        else {
          iVar1 = strcmp(argv[pos._4_4_],"--ping");
          if (iVar1 == 0) {
            g_param.option = g_param.option | OPTION_PING;
          }
          else {
            iVar1 = strcmp(argv[pos._4_4_],"--param-help");
            if (iVar1 == 0) {
              g_param.option = g_param.option | OPTION_SHOW_PARAMHELP;
            }
            else {
              iVar1 = strcmp(argv[pos._4_4_],"--show-odometry");
              if ((iVar1 == 0) || (iVar1 = strcmp(argv[pos._4_4_],"-o"), iVar1 == 0)) {
                g_param.option = g_param.option | OPTION_SHOW_ODOMETRY;
              }
              else {
                iVar1 = strcmp(argv[pos._4_4_],"--show-timestamp");
                if ((iVar1 == 0) || (iVar1 = strcmp(argv[pos._4_4_],"-t"), iVar1 == 0)) {
                  g_param.option = g_param.option | OPTION_SHOW_TIMESTAMP;
                }
                else {
                  iVar1 = strcmp(argv[pos._4_4_],"--param");
                  if ((iVar1 == 0) || (iVar1 = strcmp(argv[pos._4_4_],"-p"), iVar1 == 0)) {
                    if (argc <= pos._4_4_ + 1) break;
                    pos._4_4_ = pos._4_4_ + 1;
                    strcpy(g_param.parameter_filename,argv[pos._4_4_]);
                    g_param.option = g_param.option | OPTION_PARAM_FILE;
                  }
                  else {
                    iVar1 = strcmp(argv[pos._4_4_],"--socket");
                    if (iVar1 == 0) {
                      if (argc <= pos._4_4_ + 1) break;
                      pos._4_4_ = pos._4_4_ + 1;
                      g_param.port = atoi(argv[pos._4_4_]);
                      g_param.option = g_param.option | OPTION_SOCKET;
                    }
                    else {
                      iVar1 = strcmp(argv[pos._4_4_],"--admask");
                      if (iVar1 == 0) {
                        if (argc <= pos._4_4_ + 1) break;
                        pos._4_4_ = pos._4_4_ + 1;
                        g_param.admask = '\0';
                        for (local_28 = argv[pos._4_4_]; *local_28 != '\0'; local_28 = local_28 + 1)
                        {
                          g_param.admask = g_param.admask << 1;
                          if (*local_28 == '1') {
                            g_param.admask = g_param.admask | 1;
                          }
                        }
                      }
                      else {
                        iVar1 = strcmp(argv[pos._4_4_],"--device");
                        if ((iVar1 == 0) || (iVar1 = strcmp(argv[pos._4_4_],"-d"), iVar1 == 0)) {
                          if (argc <= pos._4_4_ + 1) break;
                          pos._4_4_ = pos._4_4_ + 1;
                          strcpy(g_param.device_name,argv[pos._4_4_]);
                        }
                        else {
                          iVar1 = strcmp(argv[pos._4_4_],"--without-control");
                          if ((iVar1 == 0) || (iVar1 = strcmp(argv[pos._4_4_],"-c"), iVar1 == 0)) {
                            g_param.option = g_param.option | OPTION_PARAM_CONTROL;
                            disable_state(YP_STATE_MOTOR);
                            disable_state(YP_STATE_VELOCITY);
                            disable_state(YP_STATE_BODY);
                            disable_state(YP_STATE_TRACKING);
                          }
                          else {
                            iVar1 = strcmp(argv[pos._4_4_],"--without-device");
                            if (iVar1 == 0) {
                              g_param.option =
                                   g_param.option |
                                   (OPTION_DO_NOT_USE_YP|OPTION_WITHOUT_DEVICE|OPTION_PARAM_CONTROL)
                              ;
                              disable_state(YP_STATE_MOTOR);
                              disable_state(YP_STATE_VELOCITY);
                              disable_state(YP_STATE_BODY);
                              disable_state(YP_STATE_TRACKING);
                            }
                            else {
                              iVar1 = strcmp(argv[pos._4_4_],"--high-resolution");
                              if ((iVar1 == 0) ||
                                 (iVar1 = strcmp(argv[pos._4_4_],"--high-resolution=yes"),
                                 iVar1 == 0)) {
                                g_param.option = g_param.option | OPTION_HIGH_PREC;
                              }
                              else {
                                iVar1 = strcmp(argv[pos._4_4_],"--high-resolution=no");
                                if (iVar1 == 0) {
                                  g_param.option = g_param.option & ~OPTION_HIGH_PREC;
                                }
                                else {
                                  iVar1 = strcmp(argv[pos._4_4_],"--version");
                                  if ((iVar1 == 0) ||
                                     (iVar1 = strcmp(argv[pos._4_4_],"-v"), iVar1 == 0)) {
                                    g_param.option = g_param.option | OPTION_VERSION;
                                  }
                                  else {
                                    iVar1 = strcmp(argv[pos._4_4_],"--verbose");
                                    if (iVar1 == 0) {
                                      g_param.output_lv = OUTPUT_LV_DEBUG;
                                    }
                                    else {
                                      iVar1 = strcmp(argv[pos._4_4_],"--quiet");
                                      if (iVar1 == 0) {
                                        g_param.output_lv = OUTPUT_LV_WARNING;
                                      }
                                      else {
                                        iVar1 = strcmp(argv[pos._4_4_],"--reconnect");
                                        if (iVar1 == 0) {
                                          g_param.option = g_param.option | OPTION_RECONNECT;
                                        }
                                        else {
                                          iVar1 = strcmp(argv[pos._4_4_],"--enable-set-bs");
                                          if (iVar1 == 0) {
                                            g_param.option = g_param.option | OPTION_ENABLE_SET_BS;
                                          }
                                          else {
                                            iVar1 = strcmp(argv[pos._4_4_],"--enable-get-digital-io"
                                                          );
                                            if (iVar1 == 0) {
                                              g_param.option =
                                                   g_param.option | OPTION_ENABLE_GET_DIGITAL_IO;
                                            }
                                            else {
                                              iVar1 = strcmp(argv[pos._4_4_],"--no-yp-protocol");
                                              if (iVar1 == 0) {
                                                g_param.option =
                                                     g_param.option | OPTION_DO_NOT_USE_YP;
                                              }
                                              else {
                                                iVar1 = strcmp(argv[pos._4_4_],"--without-ssm");
                                                if (iVar1 == 0) {
                                                  g_param.option =
                                                       g_param.option | OPTION_WITHOUT_SSM;
                                                }
                                                else {
                                                  iVar1 = strcmp(argv[pos._4_4_],"--msq-key");
                                                  if ((iVar1 == 0) ||
                                                     (iVar1 = strcmp(argv[pos._4_4_],"-q"),
                                                     iVar1 == 0)) {
                                                    if (argc <= pos._4_4_ + 1) break;
                                                    pos._4_4_ = pos._4_4_ + 1;
                                                    g_param.msq_key = atoi(argv[pos._4_4_]);
                                                  }
                                                  else {
                                                    iVar1 = strcmp(argv[pos._4_4_],"--speed");
                                                    if ((iVar1 == 0) ||
                                                       (iVar1 = strcmp(argv[pos._4_4_],"-s"),
                                                       iVar1 == 0)) {
                                                      if (argc <= pos._4_4_ + 1) break;
                                                      pos._4_4_ = pos._4_4_ + 1;
                                                      g_param.speed = atoi(argv[pos._4_4_]);
                                                    }
                                                    else {
                                                      iVar1 = strcmp(argv[pos._4_4_],"--passive");
                                                      if (iVar1 == 0) {
                                                        g_param.option =
                                                             g_param.option | OPTION_PASSIVE;
                                                      }
                                                      else {
                                                        iVar1 = strcmp(argv[pos._4_4_],
                                                                       "--update-param");
                                                        if (iVar1 == 0) {
                                                          g_param.option =
                                                               g_param.option | OPTION_UPDATE_PARAM;
                                                        }
                                                        else {
                                                          iVar1 = strcmp(argv[pos._4_4_],"--ssm-id")
                                                          ;
                                                          if (iVar1 == 0) {
                                                            if (argc <= pos._4_4_ + 1) break;
                                                            pos._4_4_ = pos._4_4_ + 1;
                                                            g_param.ssm_id = atoi(argv[pos._4_4_]);
                                                          }
                                                          else {
                                                            iVar1 = strcmp(argv[pos._4_4_],
                                                                           "--exit-on-time-jump");
                                                            if (iVar1 != 0) {
                                                              yprintf(OUTPUT_LV_ERROR,
                                                                                                                                            
                                                  "ERROR : invalid option -- \'%s\'.\n",
                                                  argv[pos._4_4_]);
                                                  return 0;
                                                  }
                                                  g_param.option =
                                                       g_param.option | OPTION_EXIT_ON_TIME_JUMP;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (argc > pos._4_4_) {
    yprintf(OUTPUT_LV_ERROR,"ERROR :  option requires an argument -- \'%s\'.\n",argv[pos._4_4_]);
  }
  argv_local._4_4_ = (uint)(argc <= pos._4_4_);
  return argv_local._4_4_;
}

Assistant:

int arg_analyze(int argc, char* argv[])
{
  int i;

  g_param.option = OPTION_DEFAULT;
  g_param.msq_key = YPSPUR_MSQ_KEY;
  g_param.output_lv = OUTPUT_LV_INFO;
  g_param.speed = 0;
  g_param.ssm_id = 0;

  strcpy(g_param.parameter_filename, DEFAULT_PARAMETER_FILE);
  strcpy(g_param.device_name, DEFAULT_DEVICE_NAME);

  for (i = 1; i < argc; i++)
  {
    if (!strcmp(argv[i], "--help") || !strcmp(argv[i], "-h"))
    {
      g_param.option |= OPTION_SHOW_HELP;
    }
    else if (!strcmp(argv[i], "--long-help"))
    {
      g_param.option |= OPTION_SHOW_LONGHELP;
    }
    else if (!strcmp(argv[i], "--daemon"))
    {
      g_param.option |= OPTION_DAEMON;
    }
    else if (!strcmp(argv[i], "--ping"))
    {
      g_param.option |= OPTION_PING;
    }
    else if (!strcmp(argv[i], "--param-help"))
    {
      g_param.option |= OPTION_SHOW_PARAMHELP;
    }
    else if (!strcmp(argv[i], "--show-odometry") || !strcmp(argv[i], "-o"))
    {
      g_param.option |= OPTION_SHOW_ODOMETRY;
    }
    else if (!strcmp(argv[i], "--show-timestamp") || !strcmp(argv[i], "-t"))
    {
      g_param.option |= OPTION_SHOW_TIMESTAMP;
    }
    else if (!strcmp(argv[i], "--param") || !strcmp(argv[i], "-p"))
    {
      if (i + 1 < argc)
      {
        i++;
        strcpy(g_param.parameter_filename, argv[i]);
        g_param.option |= OPTION_PARAM_FILE;
      }
      else
        break;
    }
    else if (!strcmp(argv[i], "--socket"))
    {
      if (i + 1 < argc)
      {
        i++;
        g_param.port = atoi(argv[i]);
        g_param.option |= OPTION_SOCKET;
      }
      else
        break;
    }
    else if (!strcmp(argv[i], "--admask"))
    {
      if (i + 1 < argc)
      {
        char* pos;

        i++;
        g_param.admask = 0;
        for (pos = argv[i]; *pos != 0; pos++)
        {
          g_param.admask = g_param.admask << 1;
          if (*pos == '1')
            g_param.admask |= 1;
        }
      }
      else
        break;
    }
    else if (!strcmp(argv[i], "--device") || !strcmp(argv[i], "-d"))
    {
      if (i + 1 < argc)
      {
        i++;
        strcpy(g_param.device_name, argv[i]);
      }
      else
        break;
    }
    else if (!strcmp(argv[i], "--without-control") || !strcmp(argv[i], "-c"))
    {
      g_param.option |= OPTION_PARAM_CONTROL;
      disable_state(YP_STATE_MOTOR);
      disable_state(YP_STATE_VELOCITY);
      disable_state(YP_STATE_BODY);
      disable_state(YP_STATE_TRACKING);
    }
    else if (!strcmp(argv[i], "--without-device"))
    {
      g_param.option |= OPTION_WITHOUT_DEVICE;
      g_param.option |= OPTION_DO_NOT_USE_YP;
      g_param.option |= OPTION_PARAM_CONTROL;
      disable_state(YP_STATE_MOTOR);
      disable_state(YP_STATE_VELOCITY);
      disable_state(YP_STATE_BODY);
      disable_state(YP_STATE_TRACKING);
    }
    else if (!strcmp(argv[i], "--high-resolution") ||
             !strcmp(argv[i], "--high-resolution=yes"))
    {
      g_param.option |= OPTION_HIGH_PREC;
    }
    else if (!strcmp(argv[i], "--high-resolution=no"))
    {
      g_param.option &= ~OPTION_HIGH_PREC;
    }
    else if (!strcmp(argv[i], "--version") || !strcmp(argv[i], "-v"))
    {
      g_param.option |= OPTION_VERSION;
    }
    else if (!strcmp(argv[i], "--verbose"))
    {
      g_param.output_lv = OUTPUT_LV_DEBUG;
    }
    else if (!strcmp(argv[i], "--quiet"))
    {
      g_param.output_lv = OUTPUT_LV_WARNING;
    }
    else if (!strcmp(argv[i], "--reconnect"))
    {
      g_param.option |= OPTION_RECONNECT;
    }
    else if (!strcmp(argv[i], "--enable-set-bs"))
    {
      g_param.option |= OPTION_ENABLE_SET_BS;
    }
    else if (!strcmp(argv[i], "--enable-get-digital-io"))
    {
      g_param.option |= OPTION_ENABLE_GET_DIGITAL_IO;
    }
    else if (!strcmp(argv[i], "--no-yp-protocol"))
    {
      g_param.option |= OPTION_DO_NOT_USE_YP;
    }
    else if (!strcmp(argv[i], "--without-ssm"))
    {
      g_param.option |= OPTION_WITHOUT_SSM;
    }
    else if (!strcmp(argv[i], "--msq-key") || !strcmp(argv[i], "-q"))
    {
      if (i + 1 < argc)
      {
        i++;
        g_param.msq_key = atoi(argv[i]);
      }
      else
        break;
    }
    else if (!strcmp(argv[i], "--speed") || !strcmp(argv[i], "-s"))
    {
      if (i + 1 < argc)
      {
        i++;
        g_param.speed = atoi(argv[i]);
      }
      else
        break;
    }
    else if (!strcmp(argv[i], "--passive"))
    {
      g_param.option |= OPTION_PASSIVE;
    }
    else if (!strcmp(argv[i], "--update-param"))
    {
      g_param.option |= OPTION_UPDATE_PARAM;
    }
    else if (!strcmp(argv[i], "--ssm-id"))
    {
      if (i + 1 < argc)
      {
        i++;
        g_param.ssm_id = atoi(argv[i]);
      }
      else
      {
        break;
      }
    }
    else if (!strcmp(argv[i], "--exit-on-time-jump"))
    {
      g_param.option |= OPTION_EXIT_ON_TIME_JUMP;
    }
    else
    {
      yprintf(OUTPUT_LV_ERROR, "ERROR : invalid option -- '%s'.\n", argv[i]);
      return 0;
    }
  }

  if (i < argc)
  {
    yprintf(OUTPUT_LV_ERROR, "ERROR :  option requires an argument -- '%s'.\n", argv[i]);
    return 0;
  }

  return 1;
}